

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O0

QString * __thiscall QString::right(QString *this,qsizetype n)

{
  QString *pQVar1;
  QString *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  QString *in_stack_ffffffffffffffb8;
  QString *in_stack_ffffffffffffffc0;
  QString *this_00;
  
  this_00 = in_RDX;
  pQVar1 = (QString *)size(in_RSI);
  if (in_RDX < pQVar1) {
    constData((QString *)0x1fa575);
    size(in_RSI);
    QString(this_00,(QChar *)in_RDX,(qsizetype)in_RSI);
  }
  else {
    QString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return in_RDI;
}

Assistant:

QString QString::right(qsizetype n) const
{
    if (size_t(n) >= size_t(size()))
        return *this;
    return QString(constData() + size() - n, n);
}